

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O0

void __thiscall LSMTree::~LSMTree(LSMTree *this)

{
  MemTable *this_00;
  DiskTable *this_01;
  int iVar1;
  undefined4 extraout_var;
  LSMTree *this_local;
  
  iVar1 = (**(this->memory->
             super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )._vptr_Dictionary)();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    DiskTable::persistent(this->disk,this->memory,false);
  }
  this_00 = this->memory;
  if (this_00 != (MemTable *)0x0) {
    MemTable::~MemTable(this_00);
    operator_delete(this_00,0x30);
  }
  this_01 = this->disk;
  if (this_01 != (DiskTable *)0x0) {
    DiskTable::~DiskTable(this_01);
    operator_delete(this_01,0x58);
  }
  std::filesystem::__cxx11::path::~path(&this->data_home);
  return;
}

Assistant:

LSMTree::~LSMTree() {
    if (memory->size() != 0) {
        disk->persistent(std::move(*memory));
    }
    delete memory;
    delete disk;
}